

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::getInteger(Functions *gl,deUint32 pname)

{
  GLenum err;
  GLint local_18;
  deUint32 local_14;
  int v;
  deUint32 pname_local;
  Functions *gl_local;
  
  local_18 = 0;
  local_14 = pname;
  _v = gl;
  (*gl->getIntegerv)(pname,&local_18);
  err = (*_v->getError)();
  glu::checkError(err,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x96);
  return local_18;
}

Assistant:

static int getInteger (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}